

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O0

void __thiscall
SGP4::DeepSpaceInitialise
          (SGP4 *this,double eosq,double sinio,double cosio,double betao,double theta2,double betao2
          ,double xmdot,double omgdot,double xnodot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double temp;
  double temp1;
  double ainv2;
  double xno2;
  double f543;
  double f542;
  double f523;
  double f522;
  double f442;
  double f441;
  double f322;
  double f321;
  double f221;
  double f220_1;
  double sini2;
  double g532;
  double g521;
  double g533;
  double g201;
  double g520;
  double g422;
  double g410;
  double g322;
  double g310_1;
  double g211;
  double f330;
  double f311;
  double f220;
  double g300;
  double g310;
  double g200;
  double s7;
  double s6;
  double s5;
  double s1;
  double s4;
  double s2;
  double s3;
  double z23;
  double z22;
  double z21;
  double z13;
  double z12;
  double z11;
  double z3;
  double z2;
  double z1;
  double z33;
  double z32;
  double z31;
  double x8;
  double x7;
  double x6;
  double x5;
  double x4;
  double x3;
  double x2;
  double x1;
  double a6;
  double a5;
  double a4;
  double a2;
  double a10;
  double a9;
  double a8;
  double a7;
  double a3;
  double a1;
  int cnt;
  double xnoi;
  double ze;
  double zn;
  double cc;
  double zsinh;
  double zcosh;
  double zsini;
  double zcosi;
  double zsing;
  double zcosg;
  double zsingl;
  double zcosgl;
  double zy;
  double zx;
  double gam;
  double c;
  double zcoshl;
  double zsinhl;
  double zsinil;
  double zcosil;
  double ctem;
  double stem;
  double xnodce;
  double local_b8;
  double jday;
  double cosg;
  double sing;
  double cosq;
  double sinq;
  double xpidot;
  double aqnv;
  double bfact;
  double shdq;
  double sgh;
  double sl;
  double si;
  double se;
  double omgdot_local;
  double xmdot_local;
  double betao2_local;
  double theta2_local;
  double betao_local;
  double cosio_local;
  double sinio_local;
  double eosq_local;
  SGP4 *this_local;
  
  si = 0.0;
  sl = 0.0;
  sgh = 0.0;
  shdq = 0.0;
  bfact = 0.0;
  aqnv = 0.0;
  se = omgdot;
  omgdot_local = xmdot;
  xmdot_local = betao2;
  betao2_local = theta2;
  theta2_local = betao;
  betao_local = cosio;
  cosio_local = sinio;
  sinio_local = eosq;
  eosq_local = (double)this;
  dVar1 = OrbitalElements::RecoveredSemiMajorAxis(&this->elements_);
  xpidot = 1.0 / dVar1;
  sinq = se + xnodot;
  dVar1 = OrbitalElements::AscendingNode(&this->elements_);
  cosq = sin(dVar1);
  dVar1 = OrbitalElements::AscendingNode(&this->elements_);
  sing = cos(dVar1);
  dVar1 = OrbitalElements::ArgumentPerigee(&this->elements_);
  cosg = sin(dVar1);
  dVar1 = OrbitalElements::ArgumentPerigee(&this->elements_);
  jday = cos(dVar1);
  xnodce = (double)OrbitalElements::Epoch(&this->elements_);
  local_b8 = DateTime::ToJ2000((DateTime *)&xnodce);
  dVar2 = Util::WrapTwoPI(local_b8 * -0.00092422029 + 4.523602);
  dVar1 = sin(dVar2);
  dVar3 = cos(dVar2);
  dVar4 = dVar3 * -0.03568096 + 0.91375164;
  dVar5 = sqrt(-dVar4 * dVar4 + 1.0);
  dVar6 = (dVar1 * 0.089683511) / dVar5;
  dVar7 = sqrt(-dVar6 * dVar6 + 1.0);
  dVar8 = local_b8 * 0.001944368 + 5.8351514;
  dVar9 = Util::WrapTwoPI((local_b8 * 0.2299715 + 4.7199672) - dVar8);
  (this->deepspace_consts_).zmol = dVar9;
  dVar1 = atan2((dVar1 * 0.39785416) / dVar5,dVar7 * dVar3 + dVar6 * 0.91744867 * dVar1);
  dVar2 = (dVar8 + dVar1) - dVar2;
  dVar1 = cos(dVar2);
  dVar3 = sin(dVar2);
  dVar8 = Util::WrapTwoPI(local_b8 * 0.017201977 + 6.2565837);
  (this->deepspace_consts_).zmos = dVar8;
  zsing = 0.1945905;
  zcosi = -0.98088458;
  zsini = 0.91744867;
  zcosh = 0.39785416;
  zsinh = sing;
  cc = cosq;
  zn = 2.9864797e-06;
  ze = 1.19459e-05;
  xnoi = 0.01675;
  dVar8 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
  for (a1._4_4_ = 0; a1._4_4_ < 2; a1._4_4_ = a1._4_4_ + 1) {
    dVar9 = zsing * zsinh + zcosi * zsini * cc;
    dVar2 = -zcosi * zsinh + zsing * zsini * cc;
    dVar10 = -zsing * cc + zcosi * zsini * zsinh;
    dVar11 = zcosi * cc + zsing * zsini * zsinh;
    dVar12 = betao_local * dVar10 + cosio_local * zcosi * zcosh;
    dVar13 = betao_local * dVar11 + cosio_local * zsing * zcosh;
    dVar10 = -cosio_local * dVar10 + betao_local * zcosi * zcosh;
    dVar11 = -cosio_local * dVar11 + betao_local * zsing * zcosh;
    dVar14 = dVar9 * jday + dVar12 * cosg;
    dVar15 = dVar2 * jday + dVar13 * cosg;
    dVar16 = -dVar9 * cosg + dVar12 * jday;
    dVar17 = -dVar2 * cosg + dVar13 * jday;
    dVar18 = dVar10 * cosg;
    dVar19 = dVar11 * cosg;
    dVar20 = dVar10 * jday;
    dVar21 = dVar11 * jday;
    dVar22 = dVar14 * 12.0 * dVar14 + -(dVar16 * 3.0 * dVar16);
    dVar23 = dVar14 * 24.0 * dVar15 + -(dVar16 * 6.0 * dVar17);
    dVar24 = dVar15 * 12.0 * dVar15 + -(dVar17 * 3.0 * dVar17);
    dVar25 = (dVar9 * dVar9 + dVar12 * dVar12) * 3.0 + dVar22 * sinio_local;
    dVar26 = (dVar9 * dVar2 + dVar12 * dVar13) * 6.0 + dVar23 * sinio_local;
    dVar27 = (dVar2 * dVar2 + dVar13 * dVar13) * 3.0 + dVar24 * sinio_local;
    dVar28 = dVar9 * -6.0 * dVar10 +
             sinio_local * (dVar14 * -24.0 * dVar20 + -(dVar16 * 6.0 * dVar18));
    dVar34 = sinio_local *
             ((dVar15 * dVar20 + dVar14 * dVar21) * -24.0 +
             -((dVar16 * dVar19 + dVar17 * dVar18) * 6.0));
    dVar29 = dVar2 * -6.0 * dVar11 +
             sinio_local * (dVar15 * -24.0 * dVar21 + -(dVar17 * 6.0 * dVar19));
    dVar30 = dVar12 * 6.0 * dVar10 +
             sinio_local * (dVar14 * 24.0 * dVar18 + -(dVar16 * 6.0 * dVar20));
    dVar35 = sinio_local *
             ((dVar15 * dVar18 + dVar14 * dVar19) * 24.0 +
             -((dVar17 * dVar20 + dVar16 * dVar21) * 6.0));
    dVar18 = dVar13 * 6.0 * dVar11 +
             sinio_local * (dVar15 * 24.0 * dVar19 + -(dVar17 * 6.0 * dVar21));
    dVar19 = xmdot_local * dVar22 + dVar25 + dVar25;
    dVar20 = xmdot_local * dVar23;
    dVar21 = xmdot_local * dVar24 + dVar27 + dVar27;
    dVar25 = zn * (1.0 / dVar8);
    dVar27 = (dVar25 * -0.5) / theta2_local;
    dVar31 = dVar25 * theta2_local;
    dVar32 = OrbitalElements::Eccentricity(&this->elements_);
    dVar32 = dVar32 * -15.0 * dVar31;
    si = dVar32 * ze * (dVar14 * dVar16 + dVar15 * dVar17);
    sl = dVar27 * ze * (dVar28 + dVar29);
    sgh = -ze * dVar25 * (sinio_local * -6.0 + ((dVar19 + dVar21) - 14.0));
    shdq = dVar31 * ze * ((dVar22 + dVar24) - 6.0);
    dVar33 = OrbitalElements::Inclination(&this->elements_);
    if ((dVar33 < 0.052359877) ||
       (dVar33 = OrbitalElements::Inclination(&this->elements_), 3.0892327765897933 < dVar33)) {
      bfact = 0.0;
    }
    else {
      bfact = (-ze * dVar27 * (dVar30 + dVar18)) / cosio_local;
    }
    (this->deepspace_consts_).ee2 = dVar32 * 2.0 * (dVar15 * dVar16 + dVar14 * dVar17);
    (this->deepspace_consts_).e3 = dVar32 * 2.0 * (dVar15 * dVar17 + -(dVar14 * dVar16));
    (this->deepspace_consts_).xi2 =
         dVar27 * 2.0 * ((dVar9 * dVar11 + dVar2 * dVar10) * -6.0 + dVar34);
    (this->deepspace_consts_).xi3 = dVar27 * 2.0 * (dVar29 - dVar28);
    (this->deepspace_consts_).xl2 = dVar25 * -2.0 * (dVar20 + dVar26 + dVar26);
    (this->deepspace_consts_).xl3 = dVar25 * -2.0 * (dVar21 - dVar19);
    (this->deepspace_consts_).xl4 = dVar25 * -2.0 * (sinio_local * -9.0 + -21.0) * xnoi;
    (this->deepspace_consts_).xgh2 = dVar31 * 2.0 * dVar23;
    (this->deepspace_consts_).xgh3 = dVar31 * 2.0 * (dVar24 - dVar22);
    (this->deepspace_consts_).xgh4 = dVar31 * -18.0 * xnoi;
    (this->deepspace_consts_).xh2 =
         dVar27 * -2.0 * ((dVar13 * dVar10 + dVar12 * dVar11) * 6.0 + dVar35);
    (this->deepspace_consts_).xh3 = dVar27 * -2.0 * (dVar18 - dVar30);
    if (a1._4_4_ == 1) break;
    (this->deepspace_consts_).sse = si;
    (this->deepspace_consts_).ssi = sl;
    (this->deepspace_consts_).ssl = sgh;
    (this->deepspace_consts_).ssh = bfact;
    (this->deepspace_consts_).ssg = -betao_local * (this->deepspace_consts_).ssh + shdq;
    (this->deepspace_consts_).se2 = (this->deepspace_consts_).ee2;
    (this->deepspace_consts_).si2 = (this->deepspace_consts_).xi2;
    (this->deepspace_consts_).sl2 = (this->deepspace_consts_).xl2;
    (this->deepspace_consts_).sgh2 = (this->deepspace_consts_).xgh2;
    (this->deepspace_consts_).sh2 = (this->deepspace_consts_).xh2;
    (this->deepspace_consts_).se3 = (this->deepspace_consts_).e3;
    (this->deepspace_consts_).si3 = (this->deepspace_consts_).xi3;
    (this->deepspace_consts_).sl3 = (this->deepspace_consts_).xl3;
    (this->deepspace_consts_).sgh3 = (this->deepspace_consts_).xgh3;
    (this->deepspace_consts_).sh3 = (this->deepspace_consts_).xh3;
    (this->deepspace_consts_).sl4 = (this->deepspace_consts_).xl4;
    (this->deepspace_consts_).sgh4 = (this->deepspace_consts_).xgh4;
    zsinh = dVar7 * sing + dVar6 * cosq;
    cc = cosq * dVar7 + -(sing * dVar6);
    ze = 0.00015835218;
    zn = 4.7968065e-07;
    xnoi = 0.0549;
    zcosh = dVar5;
    zsini = dVar4;
    zcosi = dVar3;
    zsing = dVar1;
  }
  (this->deepspace_consts_).sse = si + (this->deepspace_consts_).sse;
  (this->deepspace_consts_).ssi = sl + (this->deepspace_consts_).ssi;
  (this->deepspace_consts_).ssl = sgh + (this->deepspace_consts_).ssl;
  (this->deepspace_consts_).ssg = -betao_local * bfact + shdq + (this->deepspace_consts_).ssg;
  (this->deepspace_consts_).ssh = bfact + (this->deepspace_consts_).ssh;
  (this->deepspace_consts_).shape = NONE;
  dVar1 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
  if ((0.0052359877 <= dVar1) ||
     (dVar1 = OrbitalElements::RecoveredMeanMotion(&this->elements_), dVar1 <= 0.0034906585)) {
    dVar1 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    if (((0.00826 <= dVar1) &&
        (dVar1 = OrbitalElements::RecoveredMeanMotion(&this->elements_), dVar1 <= 0.00924)) &&
       (dVar1 = OrbitalElements::Eccentricity(&this->elements_), 0.5 <= dVar1)) {
      (this->deepspace_consts_).shape = RESONANCE;
      dVar1 = OrbitalElements::Eccentricity(&this->elements_);
      dVar3 = OrbitalElements::Eccentricity(&this->elements_);
      if (0.65 < dVar3) {
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g310_1 = EvaluateCubicPolynomial(dVar3,-72.099,331.819,-508.738,266.724);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g322 = EvaluateCubicPolynomial(dVar3,-346.844,1582.851,-2415.925,1246.113);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g410 = EvaluateCubicPolynomial(dVar3,-342.585,1554.908,-2366.899,1215.972);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g422 = EvaluateCubicPolynomial(dVar3,-1052.797,4758.686,-7193.992,3651.957);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g520 = EvaluateCubicPolynomial(dVar3,-3581.69,16178.11,-24462.77,12422.52);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        if (0.715 < dVar3) {
          dVar3 = OrbitalElements::Eccentricity(&this->elements_);
          g201 = EvaluateCubicPolynomial(dVar3,-5149.66,29936.92,-54087.36,31324.56);
        }
        else {
          dVar3 = OrbitalElements::Eccentricity(&this->elements_);
          g201 = EvaluateCubicPolynomial(dVar3,1464.74,-4664.75,3763.64,0.0);
        }
      }
      else {
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g310_1 = EvaluateCubicPolynomial(dVar3,3.616,-13.247,16.29,0.0);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g322 = EvaluateCubicPolynomial(dVar3,-19.302,117.39,-228.419,156.591);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g410 = EvaluateCubicPolynomial(dVar3,-18.9068,109.7927,-214.6334,146.5816);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g422 = EvaluateCubicPolynomial(dVar3,-41.122,242.694,-471.094,313.953);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g520 = EvaluateCubicPolynomial(dVar3,-146.407,841.88,-1629.014,1083.435);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g201 = EvaluateCubicPolynomial(dVar3,-532.114,3017.977,-5740.032,3708.276);
      }
      dVar3 = OrbitalElements::Eccentricity(&this->elements_);
      if (0.7 <= dVar3) {
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g521 = EvaluateCubicPolynomial(dVar3,-37995.78,161616.52,-229838.2,109377.94);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g532 = EvaluateCubicPolynomial(dVar3,-51752.104,218913.95,-309468.16,146349.42);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        sini2 = EvaluateCubicPolynomial(dVar3,-40023.88,170470.89,-242699.48,115605.82);
      }
      else {
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g521 = EvaluateCubicPolynomial(dVar3,-919.2277,4988.61,-9064.77,5542.21);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        g532 = EvaluateCubicPolynomial(dVar3,-822.71072,4568.6173,-8491.4146,5337.524);
        dVar3 = OrbitalElements::Eccentricity(&this->elements_);
        sini2 = EvaluateCubicPolynomial(dVar3,-853.666,4690.25,-8624.77,5341.4);
      }
      dVar3 = cosio_local * cosio_local;
      dVar4 = (betao_local + betao_local + 1.0 + betao2_local) * 0.75;
      dVar5 = cosio_local * 1.875;
      dVar12 = betao_local + betao_local;
      dVar13 = betao2_local * -3.0;
      dVar6 = cosio_local * -1.875;
      dVar17 = betao_local + betao_local;
      dVar14 = betao2_local * -3.0;
      dVar7 = cosio_local * 9.84375;
      dVar21 = betao_local + betao_local;
      dVar22 = betao2_local * -5.0;
      dVar18 = betao_local * 4.0;
      dVar23 = betao2_local * 6.0;
      dVar8 = cosio_local *
              (dVar3 * 4.92187512 * (betao2_local * 10.0 + betao_local * -4.0 + -2.0) +
              (betao2_local * -3.0 + betao_local + betao_local + 1.0) * 6.56250012);
      dVar9 = cosio_local * 29.53125;
      dVar19 = betao_local * -8.0;
      dVar15 = betao2_local * (betao2_local * 10.0 + betao_local * 8.0 + -12.0);
      dVar2 = cosio_local * 29.53125;
      dVar20 = betao_local * -8.0;
      dVar16 = betao2_local * (betao2_local * -10.0 + betao_local * 8.0 + 12.0);
      dVar10 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
      dVar11 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
      dVar11 = dVar10 * dVar11 * 3.0 * xpidot * xpidot;
      dVar10 = dVar11 * 1.7891679e-06;
      (this->deepspace_consts_).d2201 = dVar10 * dVar4 * (-(dVar1 - 0.64) * 0.44 + -0.306);
      (this->deepspace_consts_).d2211 = dVar10 * dVar3 * 1.5 * g310_1;
      dVar11 = xpidot * dVar11;
      dVar1 = dVar11 * 3.7393792e-07;
      (this->deepspace_consts_).d3210 = dVar1 * dVar5 * (dVar13 + (1.0 - dVar12)) * g322;
      (this->deepspace_consts_).d3222 = dVar1 * dVar6 * (dVar14 + dVar17 + 1.0) * g410;
      dVar11 = xpidot * dVar11;
      dVar1 = dVar11 * 2.0 * 7.3636953e-09;
      (this->deepspace_consts_).d4410 = dVar1 * dVar3 * 35.0 * dVar4 * g422;
      (this->deepspace_consts_).d4422 = dVar1 * dVar3 * 39.375 * dVar3 * g520;
      dVar11 = xpidot * dVar11;
      dVar1 = dVar11 * 1.1428639e-07;
      (this->deepspace_consts_).d5220 =
           dVar1 * dVar7 * (dVar3 * (dVar22 + (1.0 - dVar21)) +
                           (dVar23 + dVar18 + -2.0) * 0.33333333) * g201;
      (this->deepspace_consts_).d5232 = dVar1 * dVar8 * sini2;
      dVar1 = dVar11 * 2.0 * 2.1765803e-09;
      (this->deepspace_consts_).d5421 = dVar1 * dVar9 * (dVar15 + dVar19 + 2.0) * g532;
      (this->deepspace_consts_).d5433 = dVar1 * dVar2 * (dVar16 + dVar20 + -2.0) * g521;
      dVar1 = OrbitalElements::MeanAnomoly(&this->elements_);
      dVar3 = OrbitalElements::AscendingNode(&this->elements_);
      dVar4 = OrbitalElements::AscendingNode(&this->elements_);
      dVar1 = Util::WrapTwoPI(((dVar1 + dVar3 + dVar4) - (this->deepspace_consts_).gsto) -
                              (this->deepspace_consts_).gsto);
      (this->deepspace_consts_).xlamo = dVar1;
      aqnv = (((omgdot_local + xnodot + xnodot) - 0.0043752690880113) - 0.0043752690880113) +
             (this->deepspace_consts_).ssl + (this->deepspace_consts_).ssh +
             (this->deepspace_consts_).ssh;
    }
  }
  else {
    (this->deepspace_consts_).shape = SYNCHRONOUS;
    dVar1 = sinio_local * (sinio_local * 0.8125 + -2.5);
    dVar3 = sinio_local + sinio_local;
    dVar4 = sinio_local * (sinio_local * 6.60937 + -6.0);
    dVar9 = betao_local + 1.0;
    dVar2 = betao_local + 1.0;
    dVar5 = cosio_local * 0.9375 * cosio_local;
    dVar10 = betao_local * 3.0;
    dVar11 = betao_local + 1.0;
    dVar6 = betao_local + 1.0;
    dVar7 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    dVar8 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    (this->deepspace_consts_).del1 = dVar7 * 3.0 * dVar8 * xpidot * xpidot;
    (this->deepspace_consts_).del2 =
         (this->deepspace_consts_).del1 * 2.0 * dVar9 * 0.75 * dVar2 * (dVar1 + 1.0) * 1.7891679e-06
    ;
    (this->deepspace_consts_).del3 =
         (this->deepspace_consts_).del1 * 3.0 * dVar6 * 1.875 * dVar6 * dVar6 * (dVar4 + 1.0) *
         2.2123015e-07 * xpidot;
    (this->deepspace_consts_).del1 =
         (this->deepspace_consts_).del1 * (dVar5 * (dVar10 + 1.0) + -(dVar11 * 0.75)) *
         (dVar3 + 1.0) * 2.1460748e-06 * xpidot;
    dVar1 = OrbitalElements::MeanAnomoly(&this->elements_);
    dVar3 = OrbitalElements::AscendingNode(&this->elements_);
    dVar4 = OrbitalElements::ArgumentPerigee(&this->elements_);
    dVar1 = Util::WrapTwoPI((dVar1 + dVar3 + dVar4) - (this->deepspace_consts_).gsto);
    (this->deepspace_consts_).xlamo = dVar1;
    aqnv = ((omgdot_local + sinq) - 0.0043752690880113) + (this->deepspace_consts_).ssl +
           (this->deepspace_consts_).ssg + (this->deepspace_consts_).ssh;
  }
  dVar1 = aqnv;
  if ((this->deepspace_consts_).shape != NONE) {
    dVar3 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    (this->deepspace_consts_).xfact = dVar1 - dVar3;
    (this->integrator_params_).atime = 0.0;
    dVar1 = OrbitalElements::RecoveredMeanMotion(&this->elements_);
    (this->integrator_params_).xni = dVar1;
    (this->integrator_params_).xli = (this->deepspace_consts_).xlamo;
  }
  return;
}

Assistant:

void SGP4::DeepSpaceInitialise(
        const double eosq,
        const double sinio,
        const double cosio,
        const double betao,
        const double theta2,
        const double betao2,
        const double xmdot,
        const double omgdot,
        const double xnodot)
{
    double se = 0.0;
    double si = 0.0;
    double sl = 0.0;
    double sgh = 0.0;
    double shdq = 0.0;

    double bfact = 0.0;

    static const double ZNS = 1.19459E-5;
    static const double C1SS = 2.9864797E-6;
    static const double ZES = 0.01675;
    static const double ZNL = 1.5835218E-4;
    static const double C1L = 4.7968065E-7;
    static const double ZEL = 0.05490;
    static const double ZCOSIS = 0.91744867;
    static const double ZSINI = 0.39785416;
    static const double ZSINGS = -0.98088458;
    static const double ZCOSGS = 0.1945905;
    static const double Q22 = 1.7891679E-6;
    static const double Q31 = 2.1460748E-6;
    static const double Q33 = 2.2123015E-7;
    static const double ROOT22 = 1.7891679E-6;
    static const double ROOT32 = 3.7393792E-7;
    static const double ROOT44 = 7.3636953E-9;
    static const double ROOT52 = 1.1428639E-7;
    static const double ROOT54 = 2.1765803E-9;

    const double aqnv = 1.0 / elements_.RecoveredSemiMajorAxis();
    const double xpidot = omgdot + xnodot;
    const double sinq = sin(elements_.AscendingNode());
    const double cosq = cos(elements_.AscendingNode());
    const double sing = sin(elements_.ArgumentPerigee());
    const double cosg = cos(elements_.ArgumentPerigee());

    /*
     * initialize lunar / solar terms
     */
    const double jday = elements_.Epoch().ToJ2000();

    const double xnodce = Util::WrapTwoPI(4.5236020 - 9.2422029e-4 * jday);
    const double stem = sin(xnodce);
    const double ctem = cos(xnodce);
    const double zcosil = 0.91375164 - 0.03568096 * ctem;
    const double zsinil = sqrt(1.0 - zcosil * zcosil);
    const double zsinhl = 0.089683511 * stem / zsinil;
    const double zcoshl = sqrt(1.0 - zsinhl * zsinhl);
    const double c = 4.7199672 + 0.22997150 * jday;
    const double gam = 5.8351514 + 0.0019443680 * jday;
    deepspace_consts_.zmol = Util::WrapTwoPI(c - gam);
    double zx = 0.39785416 * stem / zsinil;
    double zy = zcoshl * ctem + 0.91744867 * zsinhl * stem;
    zx = atan2(zx, zy);
    zx = gam + zx - xnodce;

    const double zcosgl = cos(zx);
    const double zsingl = sin(zx);
    deepspace_consts_.zmos = Util::WrapTwoPI(6.2565837 + 0.017201977 * jday);

    /*
     * do solar terms
     */
    double zcosg = ZCOSGS;
    double zsing = ZSINGS;
    double zcosi = ZCOSIS;
    double zsini = ZSINI;
    double zcosh = cosq;
    double zsinh = sinq;
    double cc = C1SS;
    double zn = ZNS;
    double ze = ZES;
    const double xnoi = 1.0 / elements_.RecoveredMeanMotion();

    for (int cnt = 0; cnt < 2; cnt++)
    {
        /*
         * solar terms are done a second time after lunar terms are done
         */
        const double a1 = zcosg * zcosh + zsing * zcosi * zsinh;
        const double a3 = -zsing * zcosh + zcosg * zcosi * zsinh;
        const double a7 = -zcosg * zsinh + zsing * zcosi * zcosh;
        const double a8 = zsing * zsini;
        const double a9 = zsing * zsinh + zcosg * zcosi*zcosh;
        const double a10 = zcosg * zsini;
        const double a2 = cosio * a7 + sinio * a8;
        const double a4 = cosio * a9 + sinio * a10;
        const double a5 = -sinio * a7 + cosio * a8;
        const double a6 = -sinio * a9 + cosio * a10;
        const double x1 = a1 * cosg + a2 * sing;
        const double x2 = a3 * cosg + a4 * sing;
        const double x3 = -a1 * sing + a2 * cosg;
        const double x4 = -a3 * sing + a4 * cosg;
        const double x5 = a5 * sing;
        const double x6 = a6 * sing;
        const double x7 = a5 * cosg;
        const double x8 = a6 * cosg;
        const double z31 = 12.0 * x1 * x1 - 3. * x3 * x3;
        const double z32 = 24.0 * x1 * x2 - 6. * x3 * x4;
        const double z33 = 12.0 * x2 * x2 - 3. * x4 * x4;
        double z1 = 3.0 * (a1 * a1 + a2 * a2) + z31 * eosq;
        double z2 = 6.0 * (a1 * a3 + a2 * a4) + z32 * eosq;
        double z3 = 3.0 * (a3 * a3 + a4 * a4) + z33 * eosq;

        const double z11 = -6.0 * a1 * a5
            + eosq * (-24. * x1 * x7 - 6. * x3 * x5);
        const double z12 = -6.0 * (a1 * a6 + a3 * a5) 
            + eosq * (-24. * (x2 * x7 + x1 * x8) - 6. * (x3 * x6 + x4 * x5));
        const double z13 = -6.0 * a3 * a6
            + eosq * (-24. * x2 * x8 - 6. * x4 * x6);
        const double z21 = 6.0 * a2 * a5
            + eosq * (24. * x1 * x5 - 6. * x3 * x7);
        const double z22 = 6.0 * (a4 * a5 + a2 * a6)
            + eosq * (24. * (x2 * x5 + x1 * x6) - 6. * (x4 * x7 + x3 * x8));
        const double z23 = 6.0 * a4 * a6
            + eosq * (24. * x2 * x6 - 6. * x4 * x8);

        z1 = z1 + z1 + betao2 * z31;
        z2 = z2 + z2 + betao2 * z32;
        z3 = z3 + z3 + betao2 * z33;

        const double s3 = cc * xnoi;
        const double s2 = -0.5 * s3 / betao;
        const double s4 = s3 * betao;
        const double s1 = -15.0 * elements_.Eccentricity() * s4;
        const double s5 = x1 * x3 + x2 * x4;
        const double s6 = x2 * x3 + x1 * x4;
        const double s7 = x2 * x4 - x1 * x3;

        se = s1 * zn * s5;
        si = s2 * zn * (z11 + z13);
        sl = -zn * s3 * (z1 + z3 - 14.0 - 6.0 * eosq);
        sgh = s4 * zn * (z31 + z33 - 6.0);

        /*
         * replaced
         * sh = -zn * s2 * (z21 + z23
         * with
         * shdq = (-zn * s2 * (z21 + z23)) / sinio
         */
        if (elements_.Inclination() < 5.2359877e-2
                || elements_.Inclination() > kPI - 5.2359877e-2)
        {
            shdq = 0.0;
        }
        else
        {
            shdq = (-zn * s2 * (z21 + z23)) / sinio;
        }

        deepspace_consts_.ee2 = 2.0 * s1 * s6;
        deepspace_consts_.e3 = 2.0 * s1 * s7;
        deepspace_consts_.xi2 = 2.0 * s2 * z12;
        deepspace_consts_.xi3 = 2.0 * s2 * (z13 - z11);
        deepspace_consts_.xl2 = -2.0 * s3 * z2;
        deepspace_consts_.xl3 = -2.0 * s3 * (z3 - z1);
        deepspace_consts_.xl4 = -2.0 * s3 * (-21.0 - 9.0 * eosq) * ze;
        deepspace_consts_.xgh2 = 2.0 * s4 * z32;
        deepspace_consts_.xgh3 = 2.0 * s4 * (z33 - z31);
        deepspace_consts_.xgh4 = -18.0 * s4 * ze;
        deepspace_consts_.xh2 = -2.0 * s2 * z22;
        deepspace_consts_.xh3 = -2.0 * s2 * (z23 - z21);

        if (cnt == 1)
        {
            break;
        }
        /*
         * do lunar terms
         */
        deepspace_consts_.sse = se;
        deepspace_consts_.ssi = si;
        deepspace_consts_.ssl = sl;
        deepspace_consts_.ssh = shdq;
        deepspace_consts_.ssg = sgh - cosio * deepspace_consts_.ssh;
        deepspace_consts_.se2 = deepspace_consts_.ee2;
        deepspace_consts_.si2 = deepspace_consts_.xi2;
        deepspace_consts_.sl2 = deepspace_consts_.xl2;
        deepspace_consts_.sgh2 = deepspace_consts_.xgh2;
        deepspace_consts_.sh2 = deepspace_consts_.xh2;
        deepspace_consts_.se3 = deepspace_consts_.e3;
        deepspace_consts_.si3 = deepspace_consts_.xi3;
        deepspace_consts_.sl3 = deepspace_consts_.xl3;
        deepspace_consts_.sgh3 = deepspace_consts_.xgh3;
        deepspace_consts_.sh3 = deepspace_consts_.xh3;
        deepspace_consts_.sl4 = deepspace_consts_.xl4;
        deepspace_consts_.sgh4 = deepspace_consts_.xgh4;
        zcosg = zcosgl;
        zsing = zsingl;
        zcosi = zcosil;
        zsini = zsinil;
        zcosh = zcoshl * cosq + zsinhl * sinq;
        zsinh = sinq * zcoshl - cosq * zsinhl;
        zn = ZNL;
        cc = C1L;
        ze = ZEL;
    }

    deepspace_consts_.sse += se;
    deepspace_consts_.ssi += si;
    deepspace_consts_.ssl += sl;
    deepspace_consts_.ssg += sgh - cosio * shdq;
    deepspace_consts_.ssh += shdq;

    deepspace_consts_.shape = DeepSpaceConstants::NONE;

    if (elements_.RecoveredMeanMotion() < 0.0052359877
            && elements_.RecoveredMeanMotion() > 0.0034906585)
    {
        /*
         * 24h synchronous resonance terms initialisation
         */
        deepspace_consts_.shape = DeepSpaceConstants::SYNCHRONOUS;

        const double g200 = 1.0 + eosq * (-2.5 + 0.8125 * eosq);
        const double g310 = 1.0 + 2.0 * eosq;
        const double g300 = 1.0 + eosq * (-6.0 + 6.60937 * eosq);
        const double f220 = 0.75 * (1.0 + cosio) * (1.0 + cosio);
        const double f311 = 0.9375 * sinio * sinio * (1.0 + 3.0 * cosio)
            - 0.75 * (1.0 + cosio);
        double f330 = 1.0 + cosio;
        f330 = 1.875 * f330 * f330 * f330;
        deepspace_consts_.del1 = 3.0 * elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion()
            * aqnv * aqnv;
        deepspace_consts_.del2 = 2.0 * deepspace_consts_.del1
            * f220 * g200 * Q22;
        deepspace_consts_.del3 = 3.0 * deepspace_consts_.del1
            * f330 * g300 * Q33 * aqnv;
        deepspace_consts_.del1 = deepspace_consts_.del1
            * f311 * g310 * Q31 * aqnv;

        deepspace_consts_.xlamo = Util::WrapTwoPI(elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.ArgumentPerigee()
                - deepspace_consts_.gsto);
        bfact = xmdot + xpidot - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssg
            + deepspace_consts_.ssh;
    }
    else if (elements_.RecoveredMeanMotion() < 8.26e-3
            || elements_.RecoveredMeanMotion() > 9.24e-3
            || elements_.Eccentricity() < 0.5)
    {
        // do nothing
    }
    else
    {
        /*
         * geopotential resonance initialisation for 12 hour orbits
         */
        deepspace_consts_.shape = DeepSpaceConstants::RESONANCE;

        double g211;
        double g310;
        double g322;
        double g410;
        double g422;
        double g520;

        double g201 = -0.306 - (elements_.Eccentricity() - 0.64) * 0.440;

        if (elements_.Eccentricity() <= 0.65)
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    3.616, -13.247, 16.290, 0.0);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -19.302, 117.390, -228.419, 156.591);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -18.9068, 109.7927, -214.6334, 146.5816);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -41.122, 242.694, -471.094, 313.953);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -146.407, 841.880, -1629.014, 1083.435);
            g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -532.114, 3017.977, -5740.032, 3708.276);
        }
        else
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -72.099, 331.819, -508.738, 266.724);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -346.844, 1582.851, -2415.925, 1246.113);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -342.585, 1554.908, -2366.899, 1215.972);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -1052.797, 4758.686, -7193.992, 3651.957);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -3581.69, 16178.11, -24462.77, 12422.52);

            if (elements_.Eccentricity() <= 0.715)
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        1464.74, -4664.75, 3763.64, 0.0);
            }
            else
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        -5149.66, 29936.92, -54087.36, 31324.56);
            }
        }

        double g533;
        double g521;
        double g532;

        if (elements_.Eccentricity() < 0.7)
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -919.2277, 4988.61, -9064.77, 5542.21);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -822.71072, 4568.6173, -8491.4146, 5337.524);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -853.666, 4690.25, -8624.77, 5341.4);
        }
        else
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -37995.78, 161616.52, -229838.2, 109377.94);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -51752.104, 218913.95, -309468.16, 146349.42);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -40023.88, 170470.89, -242699.48, 115605.82);
        }

        const double sini2 = sinio * sinio;
        const double f220 = 0.75 * (1.0 + 2.0 * cosio + theta2);
        const double f221 = 1.5 * sini2;
        const double f321 = 1.875 * sinio * (1.0 - 2.0 * cosio - 3.0 * theta2);
        const double f322 = -1.875 * sinio * (1.0 + 2.0 * cosio - 3.0 * theta2);
        const double f441 = 35.0 * sini2 * f220;
        const double f442 = 39.3750 * sini2 * sini2;
        const double f522 = 9.84375 * sinio
            * (sini2 * (1.0 - 2.0 * cosio - 5.0 * theta2)
                + 0.33333333 * (-2.0 + 4.0 * cosio + 6.0 * theta2));
        const double f523 = sinio
            * (4.92187512 * sini2 * (-2.0 - 4.0 * cosio + 10.0 * theta2)
                + 6.56250012 * (1.0 + 2.0 * cosio - 3.0 * theta2));
        const double f542 = 29.53125 * sinio * (2.0 - 8.0 * cosio + theta2 *
                (-12.0 + 8.0 * cosio + 10.0 * theta2));
        const double f543 = 29.53125 * sinio * (-2.0 - 8.0 * cosio + theta2 *
                (12.0 + 8.0 * cosio - 10.0 * theta2));

        const double xno2 = elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion();
        const double ainv2 = aqnv * aqnv;

        double temp1 = 3.0 * xno2 * ainv2;
        double temp = temp1 * ROOT22;
        deepspace_consts_.d2201 = temp * f220 * g201;
        deepspace_consts_.d2211 = temp * f221 * g211;

        temp1 *= aqnv;
        temp = temp1 * ROOT32;
        deepspace_consts_.d3210 = temp * f321 * g310;
        deepspace_consts_.d3222 = temp * f322 * g322;

        temp1 *= aqnv;
        temp = 2.0 * temp1 * ROOT44;
        deepspace_consts_.d4410 = temp * f441 * g410;
        deepspace_consts_.d4422 = temp * f442 * g422;

        temp1 *= aqnv;
        temp = temp1 * ROOT52;
        deepspace_consts_.d5220 = temp * f522 * g520;
        deepspace_consts_.d5232 = temp * f523 * g532;

        temp = 2.0 * temp1 * ROOT54;
        deepspace_consts_.d5421 = temp * f542 * g521;
        deepspace_consts_.d5433 = temp * f543 * g533;

        deepspace_consts_.xlamo = Util::WrapTwoPI(
                elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.AscendingNode()
                - deepspace_consts_.gsto
                - deepspace_consts_.gsto);
        bfact = xmdot
            + xnodot + xnodot
            - kTHDT - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssh
            + deepspace_consts_.ssh;
    }

    if (deepspace_consts_.shape != DeepSpaceConstants::NONE)
    {
        /*
         * initialise integrator
         */
        deepspace_consts_.xfact = bfact - elements_.RecoveredMeanMotion();
        integrator_params_.atime = 0.0;
        integrator_params_.xni = elements_.RecoveredMeanMotion();
        integrator_params_.xli = deepspace_consts_.xlamo;
    }
}